

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

qreal __thiscall QGraphicsItem::boundingRegionGranularity(QGraphicsItem *this)

{
  long lVar1;
  QGraphicsItemPrivate *pQVar2;
  long in_RDI;
  long in_FS_OFFSET;
  double dVar3;
  QVariant *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffd0;
  Extra type;
  undefined8 in_stack_ffffffffffffffd8;
  
  type = (Extra)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
           operator->((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                       *)(in_RDI + 8));
  if ((*(ulong *)&pQVar2->field_0x160 >> 0x17 & 1) == 0) {
    dVar3 = 0.0;
  }
  else {
    QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
              ((QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_> *
               )(in_RDI + 8));
    QGraphicsItemPrivate::extra((QGraphicsItemPrivate *)in_stack_ffffffffffffffd8,type);
    dVar3 = qvariant_cast<double>(in_stack_ffffffffffffffb0);
    ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return dVar3;
}

Assistant:

qreal QGraphicsItem::boundingRegionGranularity() const
{
    return d_ptr->hasBoundingRegionGranularity
        ? qvariant_cast<qreal>(d_ptr->extra(QGraphicsItemPrivate::ExtraBoundingRegionGranularity))
        : 0;
}